

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

symbol * evaluate_preop(dmr_C *C,expression *expr)

{
  unsigned_long_long uVar1;
  int iVar2;
  symbol *psVar3;
  expression *peVar4;
  char *pcVar5;
  expression *arg;
  symbol *ctype;
  expression *expr_local;
  dmr_C *C_local;
  
  arg = (expression *)((expr->field_5).expr_list)->next_;
  iVar2 = expr->op;
  if (iVar2 == 0x21) {
    if ((*(ushort *)expr >> 8 != 0) && ((*(ushort *)(expr->field_5).field_3.unop >> 8 & 1) == 0)) {
      *(ushort *)expr = *(ushort *)expr & 0xff;
    }
    if (((ulong)((expression_list *)arg)->list_[8] & 0x8000000) != 0) {
      dmrC_warning(C,expr->pos,"testing a \'safe expression\'");
    }
    iVar2 = dmrC_is_float_type(C->S,(symbol *)arg);
    if (iVar2 == 0) {
      iVar2 = dmrC_get_sym_type((symbol *)arg);
      if (iVar2 == 0x10) {
        pcVar5 = dmrC_show_typename(C,(symbol *)((expression_list *)arg)->list_[0xc]);
        dmrC_warning(C,expr->pos,"%s degrades to integer",pcVar5);
      }
    }
    else {
      uVar1 = (expr->field_5).field_0.value;
      *(undefined1 *)expr = 0x16;
      expr->op = 0x10a;
      (expr->field_5).field_0.value = uVar1;
      peVar4 = dmrC_alloc_expression(C,expr->pos,0x1c);
      (expr->field_5).field_6.right = peVar4;
      ((expr->field_5).field_6.right)->ctype = (symbol *)arg;
      (((expr->field_5).field_6.right)->field_5).fvalue = (longdouble)0;
    }
    arg = (expression *)&C->S->int_ctype;
  }
  else {
    if (iVar2 == 0x26) {
      psVar3 = evaluate_addressof(C,expr);
      return psVar3;
    }
    if (iVar2 == 0x28) {
      memcpy(expr,(expr->field_5).field_3.unop,0x40);
      return (symbol *)(expression_list *)arg;
    }
    if (iVar2 == 0x2a) {
      psVar3 = evaluate_dereference(C,expr);
      return psVar3;
    }
    if (((iVar2 == 0x2b) || (iVar2 == 0x2d)) || (iVar2 == 0x7e)) {
      psVar3 = evaluate_sign(C,expr);
      return psVar3;
    }
    if ((iVar2 == 0x101) || (iVar2 == 0x103)) {
      psVar3 = evaluate_postop(C,expr);
      return psVar3;
    }
  }
  expr->ctype = (symbol *)arg;
  return (symbol *)arg;
}

Assistant:

static struct symbol *evaluate_preop(struct dmr_C *C, struct expression *expr)
{
	struct symbol *ctype = expr->unop->ctype;

	switch (expr->op) {
	case '(':
		*expr = *expr->unop;
		return ctype;

	case '+':
	case '-':
	case '~':
		return evaluate_sign(C, expr);

	case '*':
		return evaluate_dereference(C, expr);

	case '&':
		return evaluate_addressof(C, expr);

	case SPECIAL_INCREMENT:
	case SPECIAL_DECREMENT:
		/*
		 * From a type evaluation standpoint the preops are
		 * the same as the postops
		 */
		return evaluate_postop(C, expr);

	case '!':
		if (expr->flags && !(expr->unop->flags & Int_const_expr))
			expr->flags = 0;
		if (is_safe_type(ctype))
			dmrC_warning(C, expr->pos, "testing a 'safe expression'");
		if (dmrC_is_float_type(C->S, ctype)) {
			struct expression *arg = expr->unop;
			expr->type = EXPR_COMPARE;
			expr->op = SPECIAL_EQUAL;
			expr->left = arg;
			expr->right = dmrC_alloc_expression(C, expr->pos, EXPR_FVALUE);
			expr->right->ctype = ctype;
			expr->right->fvalue = 0;
		} else if (dmrC_is_fouled_type(ctype)) {
			dmrC_warning(C, expr->pos, "%s degrades to integer",
				dmrC_show_typename(C, ctype->ctype.base_type));
		}
		/* the result is int [6.5.3.3(5)]*/
		ctype = &C->S->int_ctype;
		break;

	default:
		break;
	}
	expr->ctype = ctype;
	return ctype;
}